

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

int32_t icu_63::MessagePattern::parseArgNumber(UnicodeString *s,int32_t start,int32_t limit)

{
  bool bVar1;
  char16_t cVar2;
  int local_24;
  UChar c;
  UBool badNumber;
  int32_t number;
  int32_t limit_local;
  int32_t start_local;
  UnicodeString *s_local;
  
  if (start < limit) {
    number = start + 1;
    cVar2 = UnicodeString::charAt(s,start);
    if (cVar2 == L'0') {
      if (number == limit) {
        return 0;
      }
      local_24 = 0;
      bVar1 = true;
    }
    else {
      if (((ushort)cVar2 < 0x31) || (0x39 < (ushort)cVar2)) {
        return -1;
      }
      local_24 = (ushort)cVar2 - 0x30;
      bVar1 = false;
    }
    while (number < limit) {
      cVar2 = UnicodeString::charAt(s,number);
      if (((ushort)cVar2 < 0x30) || (0x39 < (ushort)cVar2)) {
        return -1;
      }
      if (0xccccccb < local_24) {
        bVar1 = true;
      }
      local_24 = local_24 * 10 + ((ushort)cVar2 - 0x30);
      number = number + 1;
    }
    if (bVar1) {
      s_local._4_4_ = -2;
    }
    else {
      s_local._4_4_ = local_24;
    }
  }
  else {
    s_local._4_4_ = -2;
  }
  return s_local._4_4_;
}

Assistant:

int32_t
MessagePattern::parseArgNumber(const UnicodeString &s, int32_t start, int32_t limit) {
    // If the identifier contains only ASCII digits, then it is an argument _number_
    // and must not have leading zeros (except "0" itself).
    // Otherwise it is an argument _name_.
    if(start>=limit) {
        return UMSGPAT_ARG_NAME_NOT_VALID;
    }
    int32_t number;
    // Defer numeric errors until we know there are only digits.
    UBool badNumber;
    UChar c=s.charAt(start++);
    if(c==0x30) {
        if(start==limit) {
            return 0;
        } else {
            number=0;
            badNumber=TRUE;  // leading zero
        }
    } else if(0x31<=c && c<=0x39) {
        number=c-0x30;
        badNumber=FALSE;
    } else {
        return UMSGPAT_ARG_NAME_NOT_NUMBER;
    }
    while(start<limit) {
        c=s.charAt(start++);
        if(0x30<=c && c<=0x39) {
            if(number>=INT32_MAX/10) {
                badNumber=TRUE;  // overflow
            }
            number=number*10+(c-0x30);
        } else {
            return UMSGPAT_ARG_NAME_NOT_NUMBER;
        }
    }
    // There are only ASCII digits.
    if(badNumber) {
        return UMSGPAT_ARG_NAME_NOT_VALID;
    } else {
        return number;
    }
}